

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  ulong *puVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  BIT_CStream_t blockStream;
  FSE_CState_t local_90;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  
  if (bmi2 != 0) {
    sVar5 = ZSTD_encodeSequences_bmi2
                      (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                       CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
    return sVar5;
  }
  puVar6 = (ulong *)((long)dst + (dstCapacity - 8));
  if (dstCapacity < 9) {
    sVar5 = 0xffffffffffffffba;
  }
  else {
    blockStream.startPtr = (char *)dst;
    blockStream.endPtr = (char *)puVar6;
    FSE_initCState2(&stateMatchLength,CTable_MatchLength,(uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateOffsetBits,CTable_OffsetBits,(uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2(&local_90,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    uVar3 = LL_bits[llCodeTable[nbSeq - 1]];
    uVar15 = (ulong)((uint)sequences[nbSeq - 1].matchLength &
                    BIT_mask[ML_bits[mlCodeTable[nbSeq - 1]]]) << ((byte)uVar3 & 0x3f) |
             (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar3]);
    uVar3 = ML_bits[mlCodeTable[nbSeq - 1]] + uVar3;
    if (longOffsets == 0) {
      uVar15 = (ulong)(BIT_mask[ofCodeTable[nbSeq - 1]] & sequences[nbSeq - 1].offset) <<
               ((byte)uVar3 & 0x3f) | uVar15;
      uVar8 = uVar3 + ofCodeTable[nbSeq - 1];
    }
    else {
      uVar8 = (uint)ofCodeTable[nbSeq - 1];
      puVar10 = (ulong *)dst;
      if (uVar8 < 0x38) {
        uVar4 = sequences[nbSeq - 1].offset;
        bVar12 = 0;
      }
      else {
        uVar14 = 0;
        uVar4 = sequences[nbSeq - 1].offset;
        if (uVar8 != 0x38) {
          uVar14 = (ulong)(uVar8 - 0x38);
          uVar15 = (ulong)(BIT_mask[uVar14] & uVar4) << ((byte)uVar3 & 0x3f) | uVar15;
          uVar3 = (uVar8 + uVar3) - 0x38;
          puVar10 = (ulong *)((ulong)(uVar3 >> 3) + (long)dst);
          if (puVar6 < puVar10) {
            puVar10 = puVar6;
          }
          *(ulong *)dst = uVar15;
          uVar15 = uVar15 >> ((byte)uVar3 & 0x38);
          uVar3 = uVar3 & 7;
        }
        bVar12 = (byte)uVar14;
        uVar8 = 0x38;
      }
      uVar15 = (ulong)(uVar4 >> (bVar12 & 0x1f) & BIT_mask[uVar8]) << ((byte)uVar3 & 0x3f) | uVar15;
      uVar8 = uVar8 + uVar3;
      dst = puVar10;
    }
    *(ulong *)dst = uVar15;
    blockStream.ptr = (char *)((ulong)(uVar8 >> 3) + (long)dst);
    if (puVar6 < blockStream.ptr) {
      blockStream.ptr = (char *)puVar6;
    }
    blockStream.bitContainer = uVar15 >> ((byte)uVar8 & 0x38);
    for (uVar15 = nbSeq - 2; blockStream.bitPos = uVar8 & 7, uVar15 < nbSeq; uVar15 = uVar15 - 1) {
      bVar12 = llCodeTable[uVar15];
      bVar1 = ofCodeTable[uVar15];
      uVar8 = (uint)bVar1;
      bVar2 = mlCodeTable[uVar15];
      uVar3 = LL_bits[bVar12];
      uVar4 = ML_bits[bVar2];
      FSE_encodeSymbol(&blockStream,&stateOffsetBits,uVar8);
      FSE_encodeSymbol(&blockStream,&stateMatchLength,(uint)bVar2);
      FSE_encodeSymbol(&blockStream,&local_90,(uint)bVar12);
      uVar9 = uVar4 + uVar3 + bVar1;
      uVar13 = blockStream.bitPos;
      if (0x1e < uVar9) {
        *(size_t *)blockStream.ptr = blockStream.bitContainer;
        blockStream.ptr = blockStream.ptr + (blockStream.bitPos >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar13 = blockStream.bitPos & 7;
        blockStream.bitContainer = blockStream.bitContainer >> ((byte)blockStream.bitPos & 0x38);
      }
      uVar14 = (ulong)((uint)sequences[uVar15].matchLength & BIT_mask[uVar4]) <<
               ((byte)(uVar13 + uVar3) & 0x3f) |
               (ulong)((uint)sequences[uVar15].litLength & BIT_mask[uVar3]) << ((byte)uVar13 & 0x3f)
               | blockStream.bitContainer;
      uVar4 = uVar4 + uVar13 + uVar3;
      uVar3 = uVar4;
      if (0x38 < uVar9) {
        *(ulong *)blockStream.ptr = uVar14;
        blockStream.ptr = blockStream.ptr + (uVar4 >> 3);
        if (blockStream.endPtr < blockStream.ptr) {
          blockStream.ptr = blockStream.endPtr;
        }
        uVar3 = uVar4 & 7;
        uVar14 = uVar14 >> ((byte)uVar4 & 0x38);
      }
      if (longOffsets == 0) {
        uVar14 = (ulong)(BIT_mask[bVar1] & sequences[uVar15].offset) << ((byte)uVar3 & 0x3f) |
                 uVar14;
        uVar8 = uVar3 + uVar8;
      }
      else {
        if (bVar1 < 0x38) {
          uVar4 = sequences[uVar15].offset;
          bVar12 = 0;
        }
        else {
          uVar11 = 0;
          uVar4 = sequences[uVar15].offset;
          if (uVar8 != 0x38) {
            uVar11 = (ulong)(uVar8 - 0x38);
            uVar14 = (ulong)(BIT_mask[uVar11] & uVar4) << ((byte)uVar3 & 0x3f) | uVar14;
            uVar3 = (uVar3 + uVar8) - 0x38;
            *(ulong *)blockStream.ptr = uVar14;
            blockStream.ptr = blockStream.ptr + (uVar3 >> 3);
            if (blockStream.endPtr < blockStream.ptr) {
              blockStream.ptr = blockStream.endPtr;
            }
            uVar14 = uVar14 >> ((byte)uVar3 & 0x38);
            uVar3 = uVar3 & 7;
          }
          bVar12 = (byte)uVar11;
          uVar8 = 0x38;
        }
        uVar14 = (ulong)(uVar4 >> (bVar12 & 0x1f) & BIT_mask[uVar8]) << ((byte)uVar3 & 0x3f) |
                 uVar14;
        uVar8 = uVar8 + uVar3;
      }
      *(ulong *)blockStream.ptr = uVar14;
      blockStream.ptr = blockStream.ptr + (uVar8 >> 3);
      if (blockStream.endPtr < blockStream.ptr) {
        blockStream.ptr = blockStream.endPtr;
      }
      blockStream.bitContainer = uVar14 >> ((byte)uVar8 & 0x38);
    }
    FSE_flushCState(&blockStream,&stateMatchLength);
    FSE_flushCState(&blockStream,&stateOffsetBits);
    FSE_flushCState(&blockStream,&local_90);
    sVar7 = BIT_closeCStream(&blockStream);
    sVar5 = 0xffffffffffffffba;
    if (sVar7 != 0) {
      sVar5 = sVar7;
    }
  }
  return sVar5;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}